

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O2

int BiCG<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (TPZMatrix<float> *A,TPZFMatrix<float> *x,TPZFMatrix<float> *b,
              TPZMatrixSolver<float> *M,int64_t *max_iter,double *tol)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double local_790;
  TPZFMatrix<float> r;
  TPZFMatrix<float> rtilde;
  TPZFMatrix<float> ptilde;
  TPZFMatrix<float> p;
  TPZFMatrix<float> z;
  TPZFMatrix<float> ztilde;
  TPZFMatrix<float> alpha;
  TPZFMatrix<float> rho_1;
  TPZFMatrix<float> local_300;
  TPZFMatrix<float> qtilde;
  TPZFMatrix<float> beta;
  TPZFMatrix<float> rho_2;
  TPZFMatrix<float> q;
  
  TPZFMatrix<float>::TPZFMatrix(&rho_1,1,1);
  TPZFMatrix<float>::TPZFMatrix(&rho_2,1,1);
  TPZFMatrix<float>::TPZFMatrix(&alpha,1,1);
  lVar2 = 1;
  TPZFMatrix<float>::TPZFMatrix(&beta,1,1);
  TPZFMatrix<float>::TPZFMatrix(&z);
  TPZFMatrix<float>::TPZFMatrix(&ztilde);
  TPZFMatrix<float>::TPZFMatrix(&p);
  TPZFMatrix<float>::TPZFMatrix(&ptilde);
  TPZFMatrix<float>::TPZFMatrix(&q);
  TPZFMatrix<float>::TPZFMatrix(&qtilde);
  fVar3 = Norm(b);
  TPZMatrix<float>::operator*(&rtilde,A,x);
  TPZFMatrix<float>::operator-(&r,b,&rtilde);
  TPZFMatrix<float>::~TPZFMatrix(&rtilde);
  TPZFMatrix<float>::TPZFMatrix(&rtilde,&r);
  local_790 = (double)fVar3;
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    local_790 = 1.0;
  }
  fVar3 = Norm(&r);
  dVar5 = (double)(-(ulong)((double)fVar3 / local_790 <= *tol) & 0x3ff0000000000000);
  if (*tol < (double)fVar3 / local_790) {
    for (; lVar2 <= *max_iter; lVar2 = lVar2 + 1) {
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&r,&z,0);
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&rtilde,&ztilde,0);
      fVar3 = Dot<float>(&z,&rtilde);
      *rho_1.fElem = fVar3;
      if ((fVar3 == 0.0) && (!NAN(fVar3))) {
        fVar3 = Norm(&r);
        *tol = (double)fVar3 / local_790;
        *max_iter = lVar2;
        iVar1 = 2;
        goto LAB_00d1677b;
      }
      if (lVar2 == 1) {
        TPZFMatrix<float>::operator=(&p,&z);
        TPZFMatrix<float>::operator=(&ptilde,&ztilde);
      }
      else {
        fVar4 = *rho_2.fElem;
        *beta.fElem = fVar3 / fVar4;
        TPZFMatrix<float>::TimesBetaPlusZ(&p,fVar3 / fVar4,&z);
        TPZFMatrix<float>::TimesBetaPlusZ(&ptilde,*beta.fElem,&ztilde);
      }
      TPZMatrix<float>::operator*(&local_300,A,&p);
      TPZFMatrix<float>::operator=(&q,&local_300);
      TPZFMatrix<float>::~TPZFMatrix(&local_300);
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&ptilde,&qtilde);
      fVar3 = *rho_1.fElem;
      fVar4 = Dot<float>(&ptilde,&q);
      *alpha.fElem = fVar3 / fVar4;
      TPZFMatrix<float>::operator*(&local_300,&p,fVar3 / fVar4);
      TPZFMatrix<float>::operator+=(x,&local_300.super_TPZMatrix<float>);
      TPZFMatrix<float>::~TPZFMatrix(&local_300);
      TPZFMatrix<float>::operator*(&local_300,&q,*alpha.fElem);
      TPZFMatrix<float>::operator-=(&r,&local_300.super_TPZMatrix<float>);
      TPZFMatrix<float>::~TPZFMatrix(&local_300);
      TPZFMatrix<float>::operator*(&local_300,&qtilde,*alpha.fElem);
      TPZFMatrix<float>::operator-=(&rtilde,&local_300.super_TPZMatrix<float>);
      TPZFMatrix<float>::~TPZFMatrix(&local_300);
      *rho_2.fElem = *rho_1.fElem;
      fVar3 = Norm(&r);
      dVar5 = (double)fVar3 / local_790;
      if (dVar5 < *tol) {
        *tol = dVar5;
        *max_iter = lVar2;
        goto LAB_00d16779;
      }
    }
    *tol = dVar5;
    iVar1 = 1;
  }
  else {
    *tol = dVar5;
    *max_iter = 0;
LAB_00d16779:
    iVar1 = 0;
  }
LAB_00d1677b:
  TPZFMatrix<float>::~TPZFMatrix(&rtilde);
  TPZFMatrix<float>::~TPZFMatrix(&r);
  TPZFMatrix<float>::~TPZFMatrix(&qtilde);
  TPZFMatrix<float>::~TPZFMatrix(&q);
  TPZFMatrix<float>::~TPZFMatrix(&ptilde);
  TPZFMatrix<float>::~TPZFMatrix(&p);
  TPZFMatrix<float>::~TPZFMatrix(&ztilde);
  TPZFMatrix<float>::~TPZFMatrix(&z);
  TPZFMatrix<float>::~TPZFMatrix(&beta);
  TPZFMatrix<float>::~TPZFMatrix(&alpha);
  TPZFMatrix<float>::~TPZFMatrix(&rho_2);
  TPZFMatrix<float>::~TPZFMatrix(&rho_1);
  return iVar1;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}